

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O2

void __thiscall sznet::net::KcpConnection::handleKcpMessage(KcpConnection *this,Buffer *inputBuffer)

{
  uint uVar1;
  Timestamp __args_2;
  char *buffer;
  SourceFile file;
  SourceFile file_00;
  Logger local_1008;
  undefined1 local_38 [12];
  undefined1 local_28 [12];
  
  ikcp_input(this->m_kcp,
             (inputBuffer->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + inputBuffer->m_readerIndex,
             inputBuffer->m_writerIndex - inputBuffer->m_readerIndex);
  kcpUpdateManual(this);
  buffer = (this->m_inputBuffer).m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start + (this->m_inputBuffer).m_writerIndex;
  uVar1 = ikcp_recv(this->m_kcp,buffer,
                    *(int *)&(this->m_inputBuffer).m_buffer.
                             super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish - (int)buffer);
  if ((int)uVar1 < 0) {
    if (uVar1 < 0xfffffffe) {
      Logger::SourceFile::SourceFile<104>
                ((SourceFile *)local_28,
                 (char (*) [104])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpConnection.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_28._0_8_;
      file_00.m_size = local_28._8_4_;
      Logger::Logger(&local_1008,file_00,0x187,ERROR);
      LogStream::operator<<(&local_1008.m_impl.m_stream,"ikcp_recv recv buffer size not enough");
    }
    else {
      if (0 < g_logLevel) {
        return;
      }
      Logger::SourceFile::SourceFile<104>
                ((SourceFile *)local_38,
                 (char (*) [104])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpConnection.cpp"
                );
      file._12_4_ = 0;
      file.m_data = (char *)local_38._0_8_;
      file.m_size = local_38._8_4_;
      Logger::Logger(&local_1008,file,0x183,TRACE,"handleKcpMessage");
      LogStream::operator<<(&local_1008.m_impl.m_stream,"ikcp_recv EAGAIN ");
    }
    Logger::~Logger(&local_1008);
  }
  else {
    Buffer::hasWritten(&this->m_inputBuffer,(ulong)uVar1);
    std::__shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<sznet::net::KcpConnection,void>
              ((__shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_1008,
               (__weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    __args_2 = Timestamp::now();
    std::
    function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
    ::operator()(&this->m_kcpMessageCallback,(shared_ptr<sznet::net::KcpConnection> *)&local_1008,
                 &this->m_inputBuffer,__args_2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1008.m_impl.m_stream);
  }
  return;
}

Assistant:

void KcpConnection::handleKcpMessage(Buffer& inputBuffer)
{
	long readSize = static_cast<long>(inputBuffer.readableBytes());
	ikcp_input(m_kcp, inputBuffer.peek(), readSize);
	kcpUpdateManual();
	int bufferSize = static_cast<int>(m_inputBuffer.writableBytes());
	int recvRet = ikcp_recv(m_kcp, m_inputBuffer.beginWrite(), bufferSize);
	if (recvRet < 0)
	{
		// https://github.com/skywind3000/kcp/issues/39
		// -1 ������ȫû�����ݣ����������� EAGAIN
		// -2 �������ݲ�ȫ����Ҫ�������ݲ�����Ϊһ������������Ҳ���������� EAGAIN
		// -3 �����㴫���Ļ��泤�Ȳ���
		if (recvRet == -1 || recvRet == -2)
		{
			LOG_TRACE << "ikcp_recv EAGAIN ";
		}
		else
		{
			LOG_ERROR << "ikcp_recv recv buffer size not enough";
		}
		return;
	}
	m_inputBuffer.hasWritten(static_cast<size_t>(recvRet));
	// ��������
	m_kcpMessageCallback(shared_from_this(), &m_inputBuffer, Timestamp::now());
}